

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void do_fix_all(Am_Value_List *list,Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  char *s;
  Am_Wrapper *value;
  Am_Input_Char local_74;
  Am_Value item;
  Am_String str;
  Am_Value_List new_list;
  Am_Value local_48;
  Am_Object *local_38;
  
  local_38 = inter;
  Am_Value_List::Am_Value_List(&new_list);
  item.type = 0;
  item.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Input_Char::Am_Input_Char(&local_74,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  str.data = (Am_String_Data *)0x0;
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) {
      value = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
      Am_Object::Set(local_38,0x196,value,0x10000);
      Am_Value_List::operator=(list,&new_list);
      Am_String::~Am_String(&str);
      Am_Value::~Am_Value(&item);
      Am_Value_List::~Am_Value_List(&new_list);
      return;
    }
    in_value = Am_Value_List::Get(list);
    Am_Value::operator=(&item,in_value);
    if (item.type == 0x8008) {
      Am_String::Am_String((Am_String *)&local_48,&item);
      s = Am_String::operator_cast_to_char_((Am_String *)&local_48);
      Am_String::~Am_String((Am_String *)&local_48);
      Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_48,s,true);
      local_74.code = local_48.type;
      local_74._2_2_ = local_48._2_2_ & 0xfff | local_74._2_2_ & 0xf000;
    }
    else {
      if (item.type != Am_Input_Char::Am_Input_Char_ID) {
        Am_Error();
      }
      local_74.code = (short)item.value.long_value;
      local_74._2_2_ = (ushort)((ulong)item.value >> 0x10) & 0xfff | local_74._2_2_ & 0xf000;
    }
    Am_Input_Char::operator_cast_to_Am_Value(&local_74);
    Am_Value_List::Add(&new_list,&local_48,Am_TAIL,true);
    Am_Value::~Am_Value(&local_48);
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
do_fix_all(Am_Value_List &list, Am_Object &inter)
{
  Am_Value_List new_list;
  Am_Value item;
  Am_Input_Char ic;
  Am_String str;
  for (list.Start(); !list.Last(); list.Next()) {
    item = list.Get();
    if (item.type == Am_STRING) {
      const char *str = (Am_String)item;
      ic = Am_Input_Char(str);
    } else
      ic = item;
    new_list.Add(ic);
  }
  inter.Set(Am_SELECTION_MOVE_CHARS, new_list, Am_KEEP_FORMULAS);
  list = new_list;
}